

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O3

bool __thiscall
bssl::ssl_select_ech_config
          (bssl *this,SSL_HANDSHAKE *hs,Span<unsigned_char> out_enc,size_t *out_enc_len)

{
  ushort uVar1;
  size_t sVar2;
  uint16_t uVar3;
  bssl *pbVar4;
  uchar *puVar5;
  byte bVar6;
  bool bVar7;
  uint16_t uVar8;
  int iVar9;
  uint uVar10;
  pointer __p;
  EVP_HPKE_KEM *pEVar11;
  EVP_HPKE_AEAD *aead;
  EVP_HPKE_KDF *kdf;
  uint8_t *puVar12;
  size_t info_len;
  ECHConfig *__p_00;
  undefined8 uVar13;
  long lVar14;
  uint local_124;
  bool supported;
  uint16_t local_11e;
  undefined4 local_11c;
  EVP_HPKE_AEAD *local_118;
  uint16_t kdf_id;
  bssl *local_108;
  SSLTranscript *local_100;
  EVP_HPKE_CTX *local_f8;
  SSL_HANDSHAKE *local_f0;
  uchar *local_e8;
  size_t *local_e0;
  EVP_HPKE_KEM *local_d8;
  bssl *local_d0;
  CBS child;
  ECHConfig local_b8;
  CBS cbs;
  CBS cbs_1;
  
  *(size_t *)out_enc.size_ = 0;
  bVar6 = 1;
  if (0x303 < *(ushort *)(this + 0x1e)) {
    cbs.len = *(size_t *)(*(long *)(this + 8) + 0x100);
    if (cbs.len != 0) {
      cbs.data = *(uint8_t **)(*(long *)(this + 8) + 0xf8);
      iVar9 = CBS_get_u16_length_prefixed(&cbs,&child);
      if (iVar9 == 0) {
        bVar6 = 0;
      }
      else {
        bVar6 = 0;
        if ((child.len != 0) && (cbs.len == 0)) {
          local_f8 = (EVP_HPKE_CTX *)(this + 0x350);
          local_100 = (SSLTranscript *)(this + 0x238);
          local_108 = this + 0x6a0;
          local_124 = (uint)local_108;
          local_f0 = hs;
          local_e8 = out_enc.data_;
          local_e0 = (size_t *)out_enc.size_;
          local_d0 = this;
          do {
            local_b8.cipher_suites.data_ = (uint8_t *)0x0;
            local_b8.cipher_suites.size_ = 0;
            local_b8.public_name.data_ = (uchar *)0x0;
            local_b8.public_name.size_ = 0;
            local_b8.public_key.data_ = (uint8_t *)0x0;
            local_b8.public_key.size_ = 0;
            local_b8.raw.data_ = (uint8_t *)0x0;
            local_b8.raw.size_ = 0;
            local_b8.kem_id = 0;
            local_b8.maximum_name_length = '\0';
            local_b8.config_id = '\0';
            uVar13 = 0;
            bVar7 = parse_ech_config(&child,&local_b8,&supported,false);
            if (bVar7) {
              pEVar11 = EVP_hpke_x25519_hkdf_sha256();
              sVar2 = local_b8.cipher_suites.size_;
              puVar5 = local_b8.cipher_suites.data_;
              local_11c = (undefined4)CONCAT71((int7)((ulong)uVar13 >> 8),1);
              if ((supported == true) && (local_b8.kem_id == 0x20)) {
                puVar12 = local_b8.cipher_suites.data_;
                uVar1 = *(ushort *)(*(long *)(*(long *)local_d0 + 8) + 0x10d);
                local_d8 = pEVar11;
                if ((uVar1 >> 0xb & 1) == 0) {
                  uVar10 = EVP_has_aes_hardware();
                }
                else {
                  uVar10 = uVar1 >> 0xc & 1;
                }
                cbs_1.data = puVar5;
                cbs_1.len = sVar2;
                if (sVar2 != 0) {
                  local_118 = (EVP_HPKE_AEAD *)0x0;
                  do {
                    iVar9 = CBS_get_u16(&cbs_1,&kdf_id);
                    if ((iVar9 == 0) ||
                       (iVar9 = CBS_get_u16(&cbs_1,&local_11e), uVar3 = local_11e, iVar9 == 0))
                    goto LAB_00135844;
                    lVar14 = 0;
                    do {
                      aead = (EVP_HPKE_AEAD *)(**(code **)((long)&kSupportedAEADs + lVar14))();
                      uVar8 = EVP_HPKE_AEAD_id(aead);
                      if (uVar8 == uVar3) {
                        if (((aead != (EVP_HPKE_AEAD *)0x0) && (kdf_id == 1)) &&
                           ((local_118 == (EVP_HPKE_AEAD *)0x0 ||
                            ((uVar10 == 0 && (local_11e == 3)))))) {
                          local_118 = aead;
                        }
                        break;
                      }
                      lVar14 = lVar14 + 8;
                    } while (lVar14 != 0x18);
                  } while (cbs_1.len != 0);
                  if (local_118 != (EVP_HPKE_AEAD *)0x0) {
                    kdf = EVP_hpke_hkdf_sha256();
                    CBB_zero((CBB *)&cbs_1);
                    iVar9 = CBB_init((CBB *)&cbs_1,local_b8.raw.size_ + 8);
                    if (((iVar9 == 0) ||
                        (iVar9 = CBB_add_bytes((CBB *)&cbs_1,"tls ech",8), iVar9 == 0)) ||
                       (iVar9 = CBB_add_bytes((CBB *)&cbs_1,local_b8.raw.data_,local_b8.raw.size_),
                       sVar2 = local_b8.public_key.size_, puVar5 = local_b8.public_key.data_,
                       iVar9 == 0)) {
LAB_00135a28:
                      local_124 = 0;
                    }
                    else {
                      puVar12 = CBB_data((CBB *)&cbs_1);
                      info_len = CBB_len((CBB *)&cbs_1);
                      iVar9 = EVP_HPKE_CTX_setup_sender
                                        (local_f8,(uint8_t *)local_f0,local_e0,(size_t)local_e8,
                                         local_d8,kdf,local_118,puVar5,sVar2,puVar12,info_len);
                      if ((iVar9 == 0) || (bVar7 = SSLTranscript::Init(local_100), !bVar7))
                      goto LAB_00135a28;
                      __p_00 = New<bssl::ECHConfig,bssl::ECHConfig>(&local_b8);
                      pbVar4 = local_108;
                      _kdf_id = (ECHConfig *)0x0;
                      std::__uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>::reset
                                ((__uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter> *)
                                 local_108,__p_00);
                      std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter> *)&kdf_id);
                      local_124 = (uint)(*(long *)pbVar4 != 0);
                    }
                    CBB_cleanup((CBB *)&cbs_1);
                    local_11c = 0;
                  }
                }
              }
            }
            else {
              local_11c = 0;
              local_124 = 0;
            }
LAB_00135844:
            OPENSSL_free(local_b8.raw.data_);
            if ((char)local_11c == '\0') {
              bVar6 = (byte)local_124;
              goto LAB_00135a4d;
            }
          } while (child.len != 0);
          bVar6 = 1;
        }
      }
    }
  }
LAB_00135a4d:
  return (bool)(bVar6 & 1);
}

Assistant:

bool ssl_select_ech_config(SSL_HANDSHAKE *hs, Span<uint8_t> out_enc,
                           size_t *out_enc_len) {
  *out_enc_len = 0;
  if (hs->max_version < TLS1_3_VERSION) {
    // ECH requires TLS 1.3.
    return true;
  }

  if (!hs->config->client_ech_config_list.empty()) {
    CBS cbs = CBS(hs->config->client_ech_config_list);
    CBS child;
    if (!CBS_get_u16_length_prefixed(&cbs, &child) ||  //
        CBS_len(&child) == 0 ||                        //
        CBS_len(&cbs) > 0) {
      return false;
    }
    // Look for the first ECHConfig with supported parameters.
    while (CBS_len(&child) > 0) {
      ECHConfig ech_config;
      bool supported;
      if (!parse_ech_config(&child, &ech_config, &supported,
                            /*all_extensions_mandatory=*/false)) {
        return false;
      }
      const EVP_HPKE_KEM *kem = EVP_hpke_x25519_hkdf_sha256();
      const EVP_HPKE_KDF *kdf;
      const EVP_HPKE_AEAD *aead;
      if (supported &&  //
          ech_config.kem_id == EVP_HPKE_DHKEM_X25519_HKDF_SHA256 &&
          select_ech_cipher_suite(&kdf, &aead, ech_config.cipher_suites,
                                  hs->ssl->config->aes_hw_override
                                      ? hs->ssl->config->aes_hw_override_value
                                      : EVP_has_aes_hardware())) {
        ScopedCBB info;
        static const uint8_t kInfoLabel[] = "tls ech";  // includes trailing NUL
        if (!CBB_init(info.get(), sizeof(kInfoLabel) + ech_config.raw.size()) ||
            !CBB_add_bytes(info.get(), kInfoLabel, sizeof(kInfoLabel)) ||
            !CBB_add_bytes(info.get(), ech_config.raw.data(),
                           ech_config.raw.size())) {
          return false;
        }

        if (!EVP_HPKE_CTX_setup_sender(
                hs->ech_hpke_ctx.get(), out_enc.data(), out_enc_len,
                out_enc.size(), kem, kdf, aead, ech_config.public_key.data(),
                ech_config.public_key.size(), CBB_data(info.get()),
                CBB_len(info.get())) ||
            !hs->inner_transcript.Init()) {
          return false;
        }

        hs->selected_ech_config = MakeUnique<ECHConfig>(std::move(ech_config));
        return hs->selected_ech_config != nullptr;
      }
    }
  }

  return true;
}